

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void searchCluster(Mat *binary,mPoint *point,
                  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *cluster)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_const_iterator<mPoint> _Var3;
  _Base_ptr p_Var4;
  int iVar5;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> neighbors;
  Point local_d0;
  Point local_c8;
  _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
  local_c0;
  Mat local_90 [96];
  
  std::_Rb_tree<mPoint,mPoint,std::_Identity<mPoint>,std::less<mPoint>,std::allocator<mPoint>>::
  _M_insert_unique<mPoint_const&>
            ((_Rb_tree<mPoint,mPoint,std::_Identity<mPoint>,std::less<mPoint>,std::allocator<mPoint>>
              *)cluster,point);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar5 = (point->super_Point).x;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < iVar5) {
    local_d0.y = (point->super_Point).y;
    local_d0.x = iVar5 + -1;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,(mPoint *)&local_d0);
    iVar5 = (point->super_Point).x;
  }
  iVar2 = (point->super_Point).y;
  if (0 < iVar2) {
    local_d0.y = iVar2 + -1;
    local_d0.x = iVar5;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,(mPoint *)&local_d0);
    iVar5 = (point->super_Point).x;
    iVar2 = (point->super_Point).y;
  }
  if (iVar5 < *(int *)(binary + 0xc) + -1) {
    local_d0.y = iVar2;
    local_d0.x = iVar5 + 1;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,(mPoint *)&local_d0);
    iVar2 = (point->super_Point).y;
  }
  if (iVar2 < *(int *)(binary + 8) + -1) {
    local_d0.y = iVar2 + 1;
    local_d0.x = (point->super_Point).x;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,(mPoint *)&local_d0);
  }
  p_Var1 = &(cluster->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var4 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &local_c0._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_d0.x = p_Var4[1]._M_color;
    local_d0.y = *(int *)&p_Var4[1].field_0x4;
    _Var3 = std::
            __find_if<std::_Rb_tree_const_iterator<mPoint>,__gnu_cxx::__ops::_Iter_equals_val<mPoint_const>>
                      ((cluster->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                       &local_d0);
    if (((_Rb_tree_header *)_Var3._M_node == p_Var1) &&
       (*(char *)((long)local_d0.x +
                 (long)local_d0.y * **(long **)(binary + 0x48) + *(long *)(binary + 0x10)) == -1)) {
      cv::Mat::Mat(local_90,binary);
      local_c8 = local_d0;
      searchCluster(local_90,(mPoint *)&local_c8,cluster);
      cv::Mat::~Mat(local_90);
    }
  }
  std::_Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
  ::~_Rb_tree(&local_c0);
  return;
}

Assistant:

void searchCluster(cv::Mat binary, mPoint point, std::set<mPoint>& cluster) {
	cluster.insert(point);

	std::set<mPoint> neighbors;
	if (point.x >= 1)
		neighbors.insert(mPoint(point.x - 1, point.y));
	if (point.y >= 1)
		neighbors.insert(mPoint(point.x, point.y - 1));
	if (point.x < binary.cols - 1)
		neighbors.insert(mPoint(point.x + 1, point.y));
	if (point.y < binary.rows - 1)
		neighbors.insert(mPoint(point.x, point.y + 1));

	for (auto neighbor : neighbors) {
		if (std::find(cluster.begin(), cluster.end(), neighbor) == cluster.end()) {
			if (binary.at<uchar>(neighbor) == UCHAR_MAX) {
				searchCluster(binary, neighbor, cluster);
			}
		}
	}
}